

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O1

int __thiscall QDial::notchSize(QDial *this)

{
  QWidgetData *pQVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  
  pQVar1 = (this->super_QAbstractSlider).super_QWidget.data;
  iVar4 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
  iVar5 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
  if (iVar4 < iVar5) {
    iVar5 = iVar4;
  }
  lVar2 = *(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  dVar6 = ((double)iVar5 * 0.5 *
           *(double *)(&DAT_006e3bf0 + (ulong)((*(byte *)(lVar2 + 0x298) & 2) == 0) * 8) *
          3.141592653589793) / 6.0;
  uVar3 = (ulong)DAT_0066f5c0;
  iVar4 = (int)((double)((ulong)dVar6 & 0x8000000000000000 | uVar3) + dVar6);
  iVar5 = *(int *)(lVar2 + 0x25c);
  if (iVar5 + *(int *)(lVar2 + 0x254) < *(int *)(lVar2 + 600)) {
    dVar6 = (double)(iVar4 * iVar5) / (double)(*(int *)(lVar2 + 600) - *(int *)(lVar2 + 0x254));
    iVar4 = (int)((double)((ulong)dVar6 & 0x8000000000000000 | uVar3) + dVar6);
  }
  iVar5 = (iVar4 * *(int *)(lVar2 + 0x26c)) / (int)(iVar5 + (uint)(iVar5 == 0));
  if (iVar5 < 2) {
    iVar5 = 1;
  }
  dVar6 = *(double *)(lVar2 + 0x290) / (double)iVar5;
  iVar4 = (int)((double)((ulong)dVar6 & 0x8000000000000000 | uVar3) + dVar6);
  iVar5 = 1;
  if (1 < iVar4) {
    iVar5 = iVar4;
  }
  return iVar5 * *(int *)(lVar2 + 0x26c);
}

Assistant:

inline int QWidget::width() const
{ return data->crect.width(); }